

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute_struct *
pugi::impl::anon_unknown_0::append_new_attribute(xml_node_struct *node,xml_allocator *alloc)

{
  bool bVar1;
  xml_allocator *in_RSI;
  xml_node_struct *in_RDI;
  xml_attribute_struct *attr;
  undefined8 local_8;
  
  bVar1 = xml_allocator::reserve(in_RSI);
  if (bVar1) {
    local_8 = allocate_attribute(in_RSI);
    if (local_8 == (xml_attribute_struct *)0x0) {
      local_8 = (xml_attribute_struct *)0x0;
    }
    else {
      append_attribute(local_8,in_RDI);
    }
  }
  else {
    local_8 = (xml_attribute_struct *)0x0;
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_attribute_struct* append_new_attribute(xml_node_struct* node, xml_allocator& alloc)
	{
		if (!alloc.reserve()) return NULL;

		xml_attribute_struct* attr = allocate_attribute(alloc);
		if (!attr) return NULL;

		append_attribute(attr, node);

		return attr;
	}